

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O2

uint8_t * __thiscall
arangodb::velocypack::ObjectIterator::first(ObjectIterator *this,bool useSequentialIteration)

{
  uint8_t head;
  ValueLength VVar1;
  uint8_t *puVar2;
  
  if (this->_size == 0) {
LAB_00106cde:
    puVar2 = (uint8_t *)0x0;
  }
  else {
    puVar2 = (this->_slice)._start;
    head = *puVar2;
    if (head == '\x14') {
      VVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
              getStartOffsetFromCompact
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this
                        );
    }
    else {
      if (!useSequentialIteration) goto LAB_00106cde;
      VVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::findDataOffset
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this
                         ,head);
    }
    puVar2 = puVar2 + VVar1;
  }
  return puVar2;
}

Assistant:

[[nodiscard]] uint8_t const* first(bool useSequentialIteration) const noexcept {
    if (VELOCYPACK_UNLIKELY(_size == 0)) {
      return nullptr;
    }
    auto const head = _slice.head();
    VELOCYPACK_ASSERT(head != 0x0a);  // no empty object allowed here
    if (head == 0x14) {
      return _slice.start() + _slice.getStartOffsetFromCompact();
    } else if (useSequentialIteration) {
      return _slice.start() + _slice.findDataOffset(head);
    }
    return nullptr;
  }